

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O2

FxExpression * ParseParameter(FScanner *sc,PClassActor *cls,PType *type,bool constant)

{
  char *_statestring;
  PInt *pPVar1;
  PName *pPVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  PClass *pPVar6;
  FxMultiNameState *this;
  FxConstant *pFVar7;
  FxFloatCast *this_00;
  FxBoolCast *this_01;
  FxRuntimeStateIndex *this_02;
  FxExpression *pFVar8;
  FScriptPosition *this_03;
  undefined1 local_70 [20];
  FName local_5c;
  FScriptPosition local_58;
  FName local_48;
  FSoundID local_44;
  ExpVal local_40;
  
  if ((PType *)TypeSound == type) {
    FScanner::MustGetString(sc);
    this = (FxMultiNameState *)operator_new(0x48);
    local_44.ID = S_FindSound(sc->String);
    FScriptPosition::FScriptPosition((FScriptPosition *)local_70,sc);
    FxConstant::FxConstant((FxConstant *)this,&local_44,(FScriptPosition *)local_70);
  }
  else {
    if ((((PType *)TypeBool == type) || ((PType *)TypeSInt32 == type)) ||
       ((PType *)TypeFloat64 == type)) {
      pFVar8 = ParseExpression(sc,cls,constant);
      if ((constant) && (iVar4 = (*pFVar8->_vptr_FxExpression[3])(pFVar8), (char)iVar4 == '\0')) {
        FScanner::ScriptMessage(sc,"Default parameter must be constant.");
        FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
      }
      pPVar1 = TypeSInt32;
      if ((PType *)TypeBool != type) {
        this_00 = (FxFloatCast *)operator_new(0x40);
        if ((PType *)pPVar1 != type) {
          FxFloatCast::FxFloatCast(this_00,pFVar8);
          return &this_00->super_FxExpression;
        }
        FxIntCast::FxIntCast((FxIntCast *)this_00,pFVar8);
        return &this_00->super_FxExpression;
      }
      this_01 = (FxBoolCast *)operator_new(0x40);
      FxBoolCast::FxBoolCast(this_01,pFVar8);
      return &this_01->super_FxExpression;
    }
    if (((PType *)TypeName == type) || ((PType *)TypeString == type)) {
      FScanner::SetEscape(sc,true);
      FScanner::MustGetString(sc);
      FScanner::SetEscape(sc,false);
      pPVar2 = TypeName;
      this = (FxMultiNameState *)operator_new(0x48);
      if ((PType *)pPVar2 != type) {
        strbin1((char *)&local_58);
        FScriptPosition::FScriptPosition((FScriptPosition *)local_70,sc);
        FxConstant::FxConstant((FxConstant *)this,&local_58.FileName,(FScriptPosition *)local_70);
        FString::~FString((FString *)local_70);
        this_03 = &local_58;
        goto LAB_005db007;
      }
      if (*sc->String == '\0') {
        local_5c.Index = 0;
      }
      else {
        FName::FName(&local_5c,sc->String);
      }
      FScriptPosition::FScriptPosition((FScriptPosition *)local_70,sc);
      FxConstant::FxConstant((FxConstant *)this,&local_5c,(FScriptPosition *)local_70);
    }
    else {
      if ((PType *)TypeColor == type) {
        FScanner::MustGetString(sc);
        bVar3 = FScanner::Compare(sc,"none");
        if (bVar3) {
          local_70._8_4_ = 0xffffffff;
        }
        else {
          bVar3 = FScanner::Compare(sc,(char *)"");
          local_70._8_4_ = 0;
          if (!bVar3) {
            uVar5 = V_GetColor((DWORD *)0x0,sc->String);
            local_70._8_4_ = uVar5 & 0xffffff | 0x1000000;
          }
        }
        local_70._0_8_ = TypeColor;
        pFVar7 = (FxConstant *)operator_new(0x48);
        ExpVal::ExpVal(&local_40,(ExpVal *)local_70);
        FScriptPosition::FScriptPosition(&local_58,sc);
        FxConstant::FxConstant(pFVar7,&local_40,&local_58);
        FString::~FString(&local_58.FileName);
        ExpVal::~ExpVal(&local_40);
        ExpVal::~ExpVal((ExpVal *)local_70);
        return &pFVar7->super_FxExpression;
      }
      if ((PType *)TypeState == type) {
        bVar3 = FScanner::CheckToken(sc,0x102);
        if (!bVar3) {
          if (constant) {
            FScanner::MustGetToken(sc,0x102);
            return (FxExpression *)0x0;
          }
          this_02 = (FxRuntimeStateIndex *)operator_new(0x40);
          pFVar8 = ParseExpression(sc,cls,false);
          FxRuntimeStateIndex::FxRuntimeStateIndex(this_02,pFVar8);
          return &this_02->super_FxExpression;
        }
        if ((*sc->String == '\0') || (bVar3 = FScanner::Compare(sc,"None"), bVar3)) {
          this = (FxMultiNameState *)operator_new(0x48);
          FScriptPosition::FScriptPosition((FScriptPosition *)local_70,sc);
          FxConstant::FxConstant((FxConstant *)this,(FState *)0x0,(FScriptPosition *)local_70);
        }
        else {
          bVar3 = FScanner::Compare(sc,"*");
          if (bVar3) {
            if (!constant) {
              FScanner::ScriptError(sc,"Invalid state name \'*\'");
              return (FxExpression *)0x0;
            }
            this = (FxMultiNameState *)operator_new(0x48);
            FScriptPosition::FScriptPosition((FScriptPosition *)local_70,sc);
            FxConstant::FxConstant
                      ((FxConstant *)this,(FState *)0xffffffffffffffff,(FScriptPosition *)local_70);
          }
          else {
            this = (FxMultiNameState *)operator_new(0x50);
            _statestring = sc->String;
            FScriptPosition::FScriptPosition((FScriptPosition *)local_70,sc);
            FxMultiNameState::FxMultiNameState(this,_statestring,(FScriptPosition *)local_70);
          }
        }
      }
      else {
        pPVar6 = DObject::GetClass(&type->super_DObject);
        if (pPVar6 != PClassPointer::RegistrationInfo.MyClass) {
          __assert_fail("false && \"Unknown parameter type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_parse.cpp"
                        ,0xaf,
                        "FxExpression *ParseParameter(FScanner &, PClassActor *, PType *, bool)");
        }
        FScanner::SetEscape(sc,true);
        FScanner::MustGetString(sc);
        FScanner::SetEscape(sc,false);
        this = (FxMultiNameState *)operator_new(0x48);
        pPVar6 = type[1].super_DObject.Class;
        pFVar7 = (FxConstant *)operator_new(0x48);
        FName::FName(&local_48,sc->String);
        FScriptPosition::FScriptPosition((FScriptPosition *)local_70,sc);
        FxConstant::FxConstant(pFVar7,&local_48,(FScriptPosition *)local_70);
        FxClassTypeCast::FxClassTypeCast((FxClassTypeCast *)this,pPVar6,(FxExpression *)pFVar7);
      }
    }
  }
  this_03 = (FScriptPosition *)local_70;
LAB_005db007:
  FString::~FString(&this_03->FileName);
  return &this->super_FxExpression;
}

Assistant:

FxExpression *ParseParameter(FScanner &sc, PClassActor *cls, PType *type, bool constant)
{
	FxExpression *x = NULL;
	int v;

	if (type == TypeSound)
	{
		sc.MustGetString();
		x = new FxConstant(FSoundID(sc.String), sc);
	}
	else if (type == TypeBool || type == TypeSInt32 || type == TypeFloat64)
	{
		x = ParseExpression (sc, cls, constant);
		if (constant && !x->isConstant())
		{
			sc.ScriptMessage("Default parameter must be constant.");
			FScriptPosition::ErrorCounter++;
		}
		// Do automatic coercion between bools, ints and floats.
		if (type == TypeBool)
		{
			x = new FxBoolCast(x);
		}
		else if (type == TypeSInt32)
		{
			x = new FxIntCast(x);
		}
		else
		{
			x = new FxFloatCast(x);
		}
	}
	else if (type == TypeName || type == TypeString)
	{
		sc.SetEscape(true);
		sc.MustGetString();
		sc.SetEscape(false);
		if (type == TypeName)
		{
			x = new FxConstant(sc.String[0] ? FName(sc.String) : NAME_None, sc);
		}
		else
		{
			x = new FxConstant(strbin1(sc.String), sc);
		}
	}
	else if (type == TypeColor)
	{
		sc.MustGetString ();
		if (sc.Compare("none"))
		{
			v = -1;
		}
		else if (sc.Compare(""))
		{
			v = 0;
		}
		else
		{
			int c = V_GetColor (NULL, sc.String);
			// 0 needs to be the default so we have to mark the color.
			v = MAKEARGB(1, RPART(c), GPART(c), BPART(c));
		}
		ExpVal val;
		val.Type = TypeColor;
		val.Int = v;
		x = new FxConstant(val, sc);
	}
	else if (type == TypeState)
	{
		// This forces quotation marks around the state name.
		if (sc.CheckToken(TK_StringConst))
		{
			if (sc.String[0] == 0 || sc.Compare("None"))
			{
				x = new FxConstant((FState*)NULL, sc);
			}
			else if (sc.Compare("*"))
			{
				if (constant)
				{
					x = new FxConstant((FState*)(intptr_t)-1, sc);
				}
				else sc.ScriptError("Invalid state name '*'");
			}
			else
			{
				x = new FxMultiNameState(sc.String, sc);
			}
		}
		else if (!constant)
		{
			x = new FxRuntimeStateIndex(ParseExpression(sc, cls));
		}
		else sc.MustGetToken(TK_StringConst); // This is for the error.
	}
	else if (type->GetClass() == RUNTIME_CLASS(PClassPointer))
	{	// Actor name
		sc.SetEscape(true);
		sc.MustGetString();
		sc.SetEscape(false);
		x = new FxClassTypeCast(static_cast<PClassPointer *>(type)->ClassRestriction, new FxConstant(FName(sc.String), sc));
	}
	else
	{
		assert(false && "Unknown parameter type");
		x = NULL;
	}
	return x;
}